

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O1

void __thiscall avilib::AviWriter::~AviWriter(AviWriter *this)

{
  long lVar1;
  undefined8 uVar2;
  int in_ESI;
  
  this->_vptr_AviWriter = (_func_int **)&PTR__AviWriter_0013ad38;
  close(this,in_ESI);
  std::
  _Rb_tree<int,_std::pair<const_int,_avilib::_avistreamheader>,_std::_Select1st<std::pair<const_int,_avilib::_avistreamheader>_>,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avistreamheader>_>_>
  ::~_Rb_tree(&(this->m_avisHeaders)._M_t);
  std::_Deque_base<avilib::_avioldindex,_std::allocator<avilib::_avioldindex>_>::~_Deque_base
            (&(this->m_oldIndexEntries).
              super__Deque_base<avilib::_avioldindex,_std::allocator<avilib::_avioldindex>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_avilib_streamtype_t>,_std::_Select1st<std::pair<const_int,_avilib_streamtype_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_avilib_streamtype_t>_>_>
  ::~_Rb_tree(&(this->m_streamTypes)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::map<int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>_>_>_>_>_>_>
  ::~_Rb_tree(&(this->m_stdIndexEntries)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<avilib::_avistdindex_chunk,_std::allocator<avilib::_avistdindex_chunk>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<avilib::_avistdindex_chunk,_std::allocator<avilib::_avistdindex_chunk>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<avilib::_avistdindex_chunk,_std::allocator<avilib::_avistdindex_chunk>_>_>_>_>
  ::~_Rb_tree(&(this->m_stdIndexes)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_avilib::_avisuperindex_chunk>,_std::_Select1st<std::pair<const_int,_avilib::_avisuperindex_chunk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avisuperindex_chunk>_>_>
  ::~_Rb_tree(&(this->m_superIdxs)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::~_Rb_tree(&(this->pos_streamHeader)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::~_Rb_tree(&(this->pos_odmlSuperIdx)._M_t);
  uVar2 = __filebuf;
  lVar1 = _VTT;
  *(long *)&this->_f = _VTT;
  *(undefined8 *)(&this->_f + *(long *)(lVar1 + -0x18)) = uVar2;
  std::filebuf::~filebuf((filebuf *)&this->field_0x60);
  std::ios_base::~ios_base((ios_base *)&this->field_0x150);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&(this->super_LoggingObject).m_messages);
  return;
}

Assistant:

avilib::AviWriter::~AviWriter()
{
	close();
}